

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ParseableFunctionInfo *
Js::ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(FunctionBody *functionBody)

{
  Recycler *pRVar1;
  ParseableFunctionInfo *this;
  ProxyEntryPointInfo *this_00;
  FunctionInfo *nestedFunc;
  FunctionInfo *nestedInfo;
  uint i;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  ParseableFunctionInfo *local_28;
  ParseableFunctionInfo *info;
  ScriptContext *pSStack_18;
  uint nestedCount;
  ScriptContext *scriptContext;
  FunctionBody *functionBody_local;
  
  scriptContext = (ScriptContext *)functionBody;
  pSStack_18 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  info._4_4_ = GetNestedCount((ParseableFunctionInfo *)scriptContext);
  pRVar1 = ScriptContext::GetRecycler(pSStack_18);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x6fe);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  local_60 = Memory::Recycler::AllocFinalizedWithBarrierInlined;
  local_58 = 0;
  this = (ParseableFunctionInfo *)new<Memory::Recycler>(0xb8,pRVar1,0xa35d90);
  ParseableFunctionInfo(this,(ParseableFunctionInfo *)scriptContext);
  local_28 = this;
  pRVar1 = ScriptContext::GetRecycler(pSStack_18);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_88,(type_info *)&ProxyEntryPointInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x701);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_88);
  this_00 = (ProxyEntryPointInfo *)new<Memory::Recycler>(0x18,pRVar1,0x43c4b0);
  ProxyEntryPointInfo::ProxyEntryPointInfo
            (this_00,pSStack_18->DeferredParsingThunk,(ThreadContext *)0x0);
  Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::operator=
            (&(local_28->super_FunctionProxy).m_defaultEntryPointInfo,this_00);
  for (nestedInfo._4_4_ = 0; nestedInfo._4_4_ < info._4_4_; nestedInfo._4_4_ = nestedInfo._4_4_ + 1)
  {
    nestedFunc = GetNestedFunc((ParseableFunctionInfo *)scriptContext,nestedInfo._4_4_);
    SetNestedFunc(local_28,nestedFunc,nestedInfo._4_4_,0);
  }
  return local_28;
}

Assistant:

ParseableFunctionInfo *
    ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(FunctionBody * functionBody)
    {
        ScriptContext * scriptContext = functionBody->GetScriptContext();
        uint nestedCount = functionBody->GetNestedCount();

        ParseableFunctionInfo * info = RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(),
            ParseableFunctionInfo,
            functionBody);

        // Create new entry point info
        info->m_defaultEntryPointInfo = RecyclerNew(scriptContext->GetRecycler(), ProxyEntryPointInfo, scriptContext->DeferredParsingThunk);

        // Initialize nested function array, update back pointers
        for (uint i = 0; i < nestedCount; i++)
        {
            FunctionInfo * nestedInfo = functionBody->GetNestedFunc(i);
            info->SetNestedFunc(nestedInfo, i, 0);
        }

        // Update function objects

        return info;
    }